

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateEqualsAndHashCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_00;
  long lVar1;
  bool bVar2;
  FieldGeneratorInfo *pFVar3;
  ImmutableFieldGenerator *pIVar4;
  OneofGeneratorInfo *pOVar5;
  Descriptor *pDVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  long lVar8;
  char *text;
  FieldDescriptor *pFVar9;
  int i;
  long lVar10;
  int j;
  long lVar11;
  string local_50;
  
  io::Printer::Print(printer,
                     "@java.lang.Override\npublic boolean equals(final java.lang.Object obj) {\n");
  io::Printer::Indent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_50,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "if (obj == this) {\n return true;\n}\nif (!(obj instanceof $classname$)) {\n  return super.equals(obj);\n}\n$classname$ other = ($classname$) obj;\n\n"
                     ,"classname",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  io::Printer::Print(printer,"boolean result = true;\n");
  this_00 = &this->field_generators_;
  lVar8 = 0;
  for (lVar10 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar10 < *(int *)(pDVar6 + 0x2c); lVar10 = lVar10 + 1) {
    if (*(long *)(*(long *)(pDVar6 + 0x30) + 0x60 + lVar8) == 0) {
      pFVar9 = (FieldDescriptor *)(*(long *)(pDVar6 + 0x30) + lVar8);
      pFVar3 = Context::GetFieldGeneratorInfo(this->context_,pFVar9);
      bVar2 = anon_unknown_19::CheckHasBitsForEqualsAndHashCode(pFVar9);
      if (bVar2) {
        io::Printer::Print(printer,
                           "result = result && (has$name$() == other.has$name$());\nif (has$name$()) {\n"
                           ,"name",&pFVar3->capitalized_name);
        io::Printer::Indent(printer);
        pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (this_00,pFVar9);
        (*pIVar4->_vptr_ImmutableFieldGenerator[0x11])(pIVar4,printer);
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      else {
        pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (this_00,pFVar9);
        (*pIVar4->_vptr_ImmutableFieldGenerator[0x11])(pIVar4,printer);
      }
    }
    lVar8 = lVar8 + 0xa8;
  }
  for (lVar8 = 0; lVar8 < *(int *)(pDVar6 + 0x38); lVar8 = lVar8 + 1) {
    lVar10 = lVar8 * 0x30;
    pOVar5 = Context::GetOneofGeneratorInfo
                       (this->context_,(OneofDescriptor *)(*(long *)(pDVar6 + 0x40) + lVar10));
    io::Printer::Print(printer,
                       "result = result && get$oneof_capitalized_name$Case().equals(\n    other.get$oneof_capitalized_name$Case());\n"
                       ,"oneof_capitalized_name",&pOVar5->capitalized_name);
    pOVar5 = Context::GetOneofGeneratorInfo
                       (this->context_,
                        (OneofDescriptor *)
                        (*(long *)((this->super_MessageGenerator).descriptor_ + 0x40) + lVar10));
    io::Printer::Print(printer,"if (!result) return false;\nswitch ($oneof_name$Case_) {\n",
                       "oneof_name",&pOVar5->name);
    io::Printer::Indent(printer);
    uVar7 = extraout_RDX;
    for (lVar11 = 0; lVar1 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x40),
        lVar11 < *(int *)(lVar1 + 0x1c + lVar10); lVar11 = lVar11 + 1) {
      pFVar9 = *(FieldDescriptor **)(*(long *)(lVar1 + lVar10 + 0x20) + lVar11 * 8);
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(pFVar9 + 0x38),(int)uVar7);
      io::Printer::Print(printer,"case $field_number$:\n","field_number",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      io::Printer::Indent(printer);
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,pFVar9);
      (*pIVar4->_vptr_ImmutableFieldGenerator[0x11])(pIVar4,printer);
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      uVar7 = extraout_RDX_00;
    }
    io::Printer::Print(printer,"case 0:\ndefault:\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    pDVar6 = (this->super_MessageGenerator).descriptor_;
  }
  if (*(int *)(*(long *)(pDVar6 + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,"result = result && unknownFields.equals(other.unknownFields);\n");
    pDVar6 = (this->super_MessageGenerator).descriptor_;
  }
  if (0 < *(int *)(pDVar6 + 0x68)) {
    io::Printer::Print(printer,
                       "result = result &&\n    getExtensionFields().equals(other.getExtensionFields());\n"
                      );
  }
  io::Printer::Print(printer,"return result;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,"@java.lang.Override\npublic int hashCode() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"if (memoizedHashCode != 0) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"return memoizedHashCode;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\nint hash = 41;\n");
  text = "hash = (19 * hash) + getDescriptor().hashCode();\n";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x69) != '\0') {
    text = "hash = (19 * hash) + getDescriptorForType().hashCode();\n";
  }
  io::Printer::Print(printer,text);
  lVar8 = 0;
  for (lVar10 = 0; pDVar6 = (this->super_MessageGenerator).descriptor_,
      lVar10 < *(int *)(pDVar6 + 0x2c); lVar10 = lVar10 + 1) {
    if (*(long *)(*(long *)(pDVar6 + 0x30) + 0x60 + lVar8) == 0) {
      pFVar9 = (FieldDescriptor *)(*(long *)(pDVar6 + 0x30) + lVar8);
      pFVar3 = Context::GetFieldGeneratorInfo(this->context_,pFVar9);
      bVar2 = anon_unknown_19::CheckHasBitsForEqualsAndHashCode(pFVar9);
      if (bVar2) {
        io::Printer::Print(printer,"if (has$name$()) {\n","name",&pFVar3->capitalized_name);
        io::Printer::Indent(printer);
        pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (this_00,pFVar9);
        (*pIVar4->_vptr_ImmutableFieldGenerator[0x12])(pIVar4,printer);
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      else {
        pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (this_00,pFVar9);
        (*pIVar4->_vptr_ImmutableFieldGenerator[0x12])(pIVar4,printer);
      }
    }
    lVar8 = lVar8 + 0xa8;
  }
  for (lVar8 = 0; lVar8 < *(int *)(pDVar6 + 0x38); lVar8 = lVar8 + 1) {
    lVar10 = lVar8 * 0x30;
    pOVar5 = Context::GetOneofGeneratorInfo
                       (this->context_,(OneofDescriptor *)(*(long *)(pDVar6 + 0x40) + lVar10));
    io::Printer::Print(printer,"switch ($oneof_name$Case_) {\n","oneof_name",&pOVar5->name);
    io::Printer::Indent(printer);
    uVar7 = extraout_RDX_01;
    for (lVar11 = 0; lVar1 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x40),
        lVar11 < *(int *)(lVar1 + 0x1c + lVar10); lVar11 = lVar11 + 1) {
      pFVar9 = *(FieldDescriptor **)(*(long *)(lVar1 + lVar10 + 0x20) + lVar11 * 8);
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(pFVar9 + 0x38),(int)uVar7);
      io::Printer::Print(printer,"case $field_number$:\n","field_number",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      io::Printer::Indent(printer);
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_00,pFVar9);
      (*pIVar4->_vptr_ImmutableFieldGenerator[0x12])(pIVar4,printer);
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      uVar7 = extraout_RDX_02;
    }
    io::Printer::Print(printer,"case 0:\ndefault:\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    pDVar6 = (this->super_MessageGenerator).descriptor_;
  }
  if (0 < *(int *)(pDVar6 + 0x68)) {
    io::Printer::Print(printer,"hash = hashFields(hash, getExtensionFields());\n");
  }
  io::Printer::Print(printer,"hash = (29 * hash) + unknownFields.hashCode();\n");
  io::Printer::Print(printer,"memoizedHashCode = hash;\nreturn hash;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateEqualsAndHashCode(io::Printer* printer) {
  printer->Print(
    "@java.lang.Override\n"
    "public boolean equals(final java.lang.Object obj) {\n");
  printer->Indent();
  printer->Print(
    "if (obj == this) {\n"
    " return true;\n"
    "}\n"
    "if (!(obj instanceof $classname$)) {\n"
    "  return super.equals(obj);\n"
    "}\n"
    "$classname$ other = ($classname$) obj;\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print("boolean result = true;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() == NULL) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
          "result = result && (has$name$() == other.has$name$());\n"
          "if (has$name$()) {\n",
          "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateEqualsCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print(
          "}\n");
      }
    }
  }

  // Compare oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "result = result && get$oneof_capitalized_name$Case().equals(\n"
      "    other.get$oneof_capitalized_name$Case());\n",
      "oneof_capitalized_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->capitalized_name);
    printer->Print(
      "if (!result) return false;\n"
      "switch ($oneof_name$Case_) {\n",
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_number$:\n",
        "field_number",
        SimpleItoa(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateEqualsCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
      "case 0:\n"
      "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    // Always consider unknown fields for equality. This will sometimes return
    // false for non-canonical ordering when running in LITE_RUNTIME but it's
    // the best we can do.
    printer->Print(
      "result = result && unknownFields.equals(other.unknownFields);\n");
  }
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "result = result &&\n"
      "    getExtensionFields().equals(other.getExtensionFields());\n");
  }
  printer->Print(
    "return result;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  printer->Print(
    "@java.lang.Override\n"
    "public int hashCode() {\n");
  printer->Indent();
  printer->Print(
    "if (memoizedHashCode != 0) {\n");
  printer->Indent();
  printer->Print(
    "return memoizedHashCode;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "int hash = 41;\n");

  // If we output a getDescriptor() method, use that as it is more efficient.
  if (descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print("hash = (19 * hash) + getDescriptorForType().hashCode();\n");
  } else {
    printer->Print("hash = (19 * hash) + getDescriptor().hashCode();\n");
  }

  // hashCode non-oneofs.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() == NULL) {
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      bool check_has_bits = CheckHasBitsForEqualsAndHashCode(field);
      if (check_has_bits) {
        printer->Print(
          "if (has$name$()) {\n",
          "name", info->capitalized_name);
        printer->Indent();
      }
      field_generators_.get(field).GenerateHashCode(printer);
      if (check_has_bits) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // hashCode oneofs.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
      "switch ($oneof_name$Case_) {\n",
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_number$:\n",
        "field_number",
        SimpleItoa(field->number()));
      printer->Indent();
      field_generators_.get(field).GenerateHashCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Print(
      "case 0:\n"
      "default:\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "hash = hashFields(hash, getExtensionFields());\n");
  }

  printer->Print(
    "hash = (29 * hash) + unknownFields.hashCode();\n");
  printer->Print(
    "memoizedHashCode = hash;\n"
    "return hash;\n");
  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");
}